

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCut.c
# Opt level: O3

Vec_Int_t * Abc_NtkGetNodeAttributes2(Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  uint uVar2;
  Abc_Obj_t *pNode;
  int iVar3;
  Vec_Int_t *vAttrs;
  int *__s;
  long lVar4;
  int iVar5;
  Vec_Ptr_t *pVVar6;
  int *local_40;
  
  iVar3 = Abc_NtkIsDfsOrdered(pNtk);
  if (iVar3 == 0) {
    __assert_fail("Abc_NtkIsDfsOrdered(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcCut.c"
                  ,0x2a6,"Vec_Int_t *Abc_NtkGetNodeAttributes2(Abc_Ntk_t *)");
  }
  pVVar6 = pNtk->vObjs;
  uVar2 = pVVar6->nSize;
  lVar4 = (long)(int)uVar2 + 1;
  vAttrs = (Vec_Int_t *)malloc(0x10);
  iVar5 = (int)lVar4;
  iVar3 = 0x10;
  if (0xe < (ulong)(long)(int)uVar2) {
    iVar3 = iVar5;
  }
  vAttrs->nCap = iVar3;
  if (iVar3 == 0) {
    vAttrs->pArray = (int *)0x0;
    vAttrs->nSize = iVar5;
  }
  else {
    local_40 = (int *)malloc((long)iVar3 << 2);
    vAttrs->pArray = local_40;
    vAttrs->nSize = iVar5;
    if (local_40 != (int *)0x0) {
      memset(local_40,0,lVar4 * 4);
      goto LAB_002a332a;
    }
  }
  local_40 = (int *)0x0;
LAB_002a332a:
  if (0 < (int)uVar2) {
    lVar4 = 0;
    do {
      pNode = (Abc_Obj_t *)pVVar6->pArray[lVar4];
      if ((((pNode != (Abc_Obj_t *)0x0) && (pNode->Id != 0)) &&
          ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) && (1 < (pNode->vFanouts).nSize)) {
        iVar3 = Abc_NodeIsMuxControlType(pNode);
        if (iVar3 == 0) {
          if ((pNtk->vTravIds).pArray == (int *)0x0) {
            iVar3 = pNtk->vObjs->nSize;
            uVar1 = (long)iVar3 + 500;
            iVar5 = (int)uVar1;
            if ((pNtk->vTravIds).nCap < iVar5) {
              __s = (int *)malloc(uVar1 * 4);
              (pNtk->vTravIds).pArray = __s;
              if (__s == (int *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
              (pNtk->vTravIds).nCap = iVar5;
            }
            else {
              __s = (int *)0x0;
            }
            if (-500 < iVar3) {
              memset(__s,0,(uVar1 & 0xffffffff) << 2);
            }
            (pNtk->vTravIds).nSize = iVar5;
          }
          iVar3 = pNtk->nTravIds;
          pNtk->nTravIds = iVar3 + 1;
          if (0x3ffffffe < iVar3) {
            __assert_fail("p->nTravIds < (1<<30)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                          ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
          }
          iVar3 = Abc_NtkSubDagSize_rec(pNode,vAttrs);
          if (0xf < iVar3) {
            if (uVar2 < (uint)pNode->Id) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            local_40[(uint)pNode->Id] = 1;
          }
        }
      }
      lVar4 = lVar4 + 1;
      pVVar6 = pNtk->vObjs;
    } while (lVar4 < pVVar6->nSize);
  }
  return vAttrs;
}

Assistant:

Vec_Int_t * Abc_NtkGetNodeAttributes2( Abc_Ntk_t * pNtk ) 
{
    Vec_Int_t * vAttrs;
    Abc_Obj_t * pObj;
    int i, nSize;
    assert( Abc_NtkIsDfsOrdered(pNtk) );
    vAttrs = Vec_IntStart( Abc_NtkObjNumMax(pNtk) + 1 );
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        // skip no-nodes and nodes without fanouts
        if ( pObj->Id == 0 || !(Abc_ObjIsNode(pObj) && Abc_ObjFanoutNum(pObj) > 1 && !Abc_NodeIsMuxControlType(pObj)) )
            continue;
        // the node has more than one fanout - count its sub-DAG size
        Abc_NtkIncrementTravId( pNtk );
        nSize = Abc_NtkSubDagSize_rec( pObj, vAttrs );
        if ( nSize > 15 )
            Vec_IntWriteEntry( vAttrs, pObj->Id, 1 );
    }
    return vAttrs; 
}